

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O3

void __thiscall
iDynTree::ConvexHullProjectionConstraint::buildConstraintMatrix
          (ConvexHullProjectionConstraint *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  pointer pVVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  iDynTree::MatrixDynSize::resize
            ((ulong)&this->A,
             (long)(this->projectedConvexHull).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->projectedConvexHull).m_vertices.
                   super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  iDynTree::VectorDynSize::resize((ulong)&this->b);
  pVVar6 = (this->projectedConvexHull).m_vertices.
           super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->projectedConvexHull).m_vertices.
                 super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6;
  if (lVar10 != 0) {
    uVar11 = lVar10 >> 4;
    lVar10 = 0x10;
    uVar12 = 0;
    do {
      dVar1 = *(double *)((long)pVVar6[-1].m_data + lVar10);
      pVVar5 = pVVar6;
      if (uVar12 != uVar11 - 1) {
        pVVar5 = (pointer)((long)pVVar6->m_data + lVar10);
      }
      dVar2 = *(double *)((long)pVVar6->m_data + lVar10 + -8);
      dVar3 = pVVar5->m_data[1];
      dVar4 = pVVar5->m_data[0];
      lVar7 = iDynTree::MatrixDynSize::data();
      iDynTree::MatrixDynSize::rows();
      lVar8 = iDynTree::MatrixDynSize::cols();
      pdVar9 = (double *)(lVar7 + lVar8 * uVar12 * 8);
      *pdVar9 = dVar3 - dVar2;
      pdVar9[1] = dVar1 - dVar4;
      pdVar9 = (double *)iDynTree::VectorDynSize::operator()(&this->b,uVar12);
      *pdVar9 = dVar1 * dVar3 - dVar2 * dVar4;
      uVar12 = uVar12 + 1;
      pVVar6 = (this->projectedConvexHull).m_vertices.
               super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(this->projectedConvexHull).m_vertices.
                     super__Vector_base<iDynTree::VectorFixSize<2U>,_std::allocator<iDynTree::VectorFixSize<2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4;
      lVar10 = lVar10 + 0x10;
    } while (uVar12 < uVar11);
  }
  return;
}

Assistant:

void ConvexHullProjectionConstraint::buildConstraintMatrix()
    {
        // The rows of the A matrix and of the b vector depends on the number of vertices in the convex hull
        A.resize(projectedConvexHull.getNrOfVertices(),2);
        b.resize(projectedConvexHull.getNrOfVertices());

        // We assume that the vertices in projectedConvexHull are expressed in counter-clockwise order: this
        // is ensured by the structure of the Monotone Chain algorithm

        // Iterate on all line segments one by one
        for (size_t i=0; i < projectedConvexHull.getNrOfVertices(); i++)
        {
            Vector2 p0 = projectedConvexHull(i);
            Vector2 p1;

            if ( i != projectedConvexHull.getNrOfVertices()-1 )
            {
                p1 = projectedConvexHull(i+1);
            }
            else
            {
                // if we are using the last vertix, we build the line connecting it with the first vertex
                p1 = projectedConvexHull(0);
            }

            toEigen(A).block<1,2>(i,0) = Eigen::Vector2d(p1(1)-p0(1),p0(0)-p1(0));
            b(i) = p0(0)*p1(1) - p1(0)*p0(1);
        }

        return;
    }